

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O2

string * __thiscall
iutest::WithParamInterface<bool>::MakeTestParamName_abi_cxx11_
          (string *__return_storage_ptr__,WithParamInterface<bool> *this,TestParamInfoType *info)

{
  detail::MakeIndexName_abi_cxx11_
            (__return_storage_ptr__,(detail *)this[1]._vptr_WithParamInterface,(size_t)info);
  return __return_storage_ptr__;
}

Assistant:

static const ::std::string MakeTestParamName(const TestParamInfoType& info)
    {
        return detail::MakeIndexName(info.index);
    }